

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCV.cpp
# Opt level: O1

Function * __thiscall
TCV::getRightFunction
          (TCV *this,vector<Function_*,_std::allocator<Function_*>_> *__functions,ASTNode *_node)

{
  pointer ppFVar1;
  pointer ppVVar2;
  pointer pcVar3;
  bool bVar4;
  ASTNode *_node_00;
  vector<Variable_*,_std::allocator<Variable_*>_> *pvVar5;
  string *psVar6;
  long lVar7;
  Function *pFVar8;
  pointer ppFVar9;
  ulong uVar10;
  char cVar11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  callParams;
  string fType;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_70;
  Function *local_58;
  string local_50;
  
  _node_00 = AST::ASTNode::getChild(_node,1);
  getParamsType_abi_cxx11_(&local_70,this,_node_00);
  ppFVar9 = (__functions->super__Vector_base<Function_*,_std::allocator<Function_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppFVar1 = (__functions->super__Vector_base<Function_*,_std::allocator<Function_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppFVar9 != ppFVar1) {
    do {
      pvVar5 = Function::getParams(*ppFVar9);
      cVar11 = '\x03';
      if ((long)(pvVar5->super__Vector_base<Variable_*,_std::allocator<Variable_*>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(pvVar5->super__Vector_base<Variable_*,_std::allocator<Variable_*>_>)._M_impl.
                super__Vector_impl_data._M_start >> 3 ==
          (long)local_70.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_70.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 5) {
        lVar7 = 0;
        uVar10 = 0;
        do {
          pvVar5 = Function::getParams(*ppFVar9);
          if ((ulong)((long)(pvVar5->super__Vector_base<Variable_*,_std::allocator<Variable_*>_>).
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(pvVar5->super__Vector_base<Variable_*,_std::allocator<Variable_*>_>).
                            _M_impl.super__Vector_impl_data._M_start >> 3) <= uVar10)
          goto LAB_00130ced;
          pvVar5 = Function::getParams(*ppFVar9);
          ppVVar2 = (pvVar5->super__Vector_base<Variable_*,_std::allocator<Variable_*>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          if ((ulong)((long)(pvVar5->super__Vector_base<Variable_*,_std::allocator<Variable_*>_>).
                            _M_impl.super__Vector_impl_data._M_finish - (long)ppVVar2 >> 3) <=
              uVar10) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar10);
          }
          psVar6 = Variable::getType_abi_cxx11_(ppVVar2[uVar10]);
          pcVar3 = (psVar6->_M_dataplus)._M_p;
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_50,pcVar3,pcVar3 + psVar6->_M_string_length);
          if ((ulong)((long)local_70.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_70.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar10) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar10);
          }
          bVar4 = isMatchType(&local_50,
                              (string *)
                              ((long)&((local_70.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                      _M_p + lVar7));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          uVar10 = uVar10 + 1;
          lVar7 = lVar7 + 0x20;
        } while (bVar4);
        uVar10 = (uVar10 + bVar4) - 1;
LAB_00130ced:
        cVar11 = (long)local_70.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_70.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5 == (long)(int)uVar10;
        if ((bool)cVar11) {
          local_58 = *ppFVar9;
        }
      }
      if ((cVar11 != '\x03') && (pFVar8 = local_58, cVar11 != '\0')) goto LAB_00130d36;
      ppFVar9 = ppFVar9 + 1;
    } while (ppFVar9 != ppFVar1);
  }
  pFVar8 = (Function *)0x0;
LAB_00130d36:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_70);
  return pFVar8;
}

Assistant:

Function *TCV::getRightFunction(const std::vector<Function *> &__functions, AST::ASTNode *_node) {
    auto callParams = getParamsType(_node->getChild(1));
    for (const auto &_function : __functions) {
        if (_function->getParams().size() != callParams.size()) continue;
        int matchedParams = 0;
        for (int i = 0; i < _function->getParams().size(); i++) {
            auto fType = _function->getParams().at(i)->getType();
            if (!isMatchType(fType, callParams.at(i))) break;
            else matchedParams++;
        }
        if (matchedParams == callParams.size()) return _function;
    }
    return nullptr;
}